

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall
p2t::Sweep::RotateTrianglePair(Sweep *this,Triangle *t,Point *p,Triangle *ot,Point *op)

{
  bool ce;
  bool ce_00;
  bool ce_01;
  bool ce_02;
  bool e;
  bool e_00;
  bool e_01;
  bool e_02;
  Triangle *t_00;
  Triangle *t_01;
  Triangle *t_02;
  Triangle *t_03;
  
  t_00 = Triangle::NeighborCCW(t,p);
  t_01 = Triangle::NeighborCW(t,p);
  t_02 = Triangle::NeighborCCW(ot,op);
  t_03 = Triangle::NeighborCW(ot,op);
  ce = Triangle::GetConstrainedEdgeCCW(t,p);
  ce_00 = Triangle::GetConstrainedEdgeCW(t,p);
  ce_01 = Triangle::GetConstrainedEdgeCCW(ot,op);
  ce_02 = Triangle::GetConstrainedEdgeCW(ot,op);
  e = Triangle::GetDelunayEdgeCCW(t,p);
  e_00 = Triangle::GetDelunayEdgeCW(t,p);
  e_01 = Triangle::GetDelunayEdgeCCW(ot,op);
  e_02 = Triangle::GetDelunayEdgeCW(ot,op);
  Triangle::Legalize(t,p,op);
  Triangle::Legalize(ot,op,p);
  Triangle::SetDelunayEdgeCCW(ot,p,e);
  Triangle::SetDelunayEdgeCW(t,p,e_00);
  Triangle::SetDelunayEdgeCCW(t,op,e_01);
  Triangle::SetDelunayEdgeCW(ot,op,e_02);
  Triangle::SetConstrainedEdgeCCW(ot,p,ce);
  Triangle::SetConstrainedEdgeCW(t,p,ce_00);
  Triangle::SetConstrainedEdgeCCW(t,op,ce_01);
  Triangle::SetConstrainedEdgeCW(ot,op,ce_02);
  Triangle::ClearNeighbors(t);
  Triangle::ClearNeighbors(ot);
  if (t_00 != (Triangle *)0x0) {
    Triangle::MarkNeighbor(ot,t_00);
  }
  if (t_01 != (Triangle *)0x0) {
    Triangle::MarkNeighbor(t,t_01);
  }
  if (t_02 != (Triangle *)0x0) {
    Triangle::MarkNeighbor(t,t_02);
  }
  if (t_03 != (Triangle *)0x0) {
    Triangle::MarkNeighbor(ot,t_03);
  }
  Triangle::MarkNeighbor(t,ot);
  return;
}

Assistant:

void Sweep::RotateTrianglePair(Triangle& t, Point& p, Triangle& ot, Point& op) const
{
  Triangle* n1, *n2, *n3, *n4;
  n1 = t.NeighborCCW(p);
  n2 = t.NeighborCW(p);
  n3 = ot.NeighborCCW(op);
  n4 = ot.NeighborCW(op);

  bool ce1, ce2, ce3, ce4;
  ce1 = t.GetConstrainedEdgeCCW(p);
  ce2 = t.GetConstrainedEdgeCW(p);
  ce3 = ot.GetConstrainedEdgeCCW(op);
  ce4 = ot.GetConstrainedEdgeCW(op);

  bool de1, de2, de3, de4;
  de1 = t.GetDelunayEdgeCCW(p);
  de2 = t.GetDelunayEdgeCW(p);
  de3 = ot.GetDelunayEdgeCCW(op);
  de4 = ot.GetDelunayEdgeCW(op);

  t.Legalize(p, op);
  ot.Legalize(op, p);

  // Remap delaunay_edge
  ot.SetDelunayEdgeCCW(p, de1);
  t.SetDelunayEdgeCW(p, de2);
  t.SetDelunayEdgeCCW(op, de3);
  ot.SetDelunayEdgeCW(op, de4);

  // Remap constrained_edge
  ot.SetConstrainedEdgeCCW(p, ce1);
  t.SetConstrainedEdgeCW(p, ce2);
  t.SetConstrainedEdgeCCW(op, ce3);
  ot.SetConstrainedEdgeCW(op, ce4);

  // Remap neighbors
  // XXX: might optimize the markNeighbor by keeping track of
  //      what side should be assigned to what neighbor after the
  //      rotation. Now mark neighbor does lots of testing to find
  //      the right side.
  t.ClearNeighbors();
  ot.ClearNeighbors();
  if (n1) ot.MarkNeighbor(*n1);
  if (n2) t.MarkNeighbor(*n2);
  if (n3) t.MarkNeighbor(*n3);
  if (n4) ot.MarkNeighbor(*n4);
  t.MarkNeighbor(ot);
}